

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcalc.c
# Opt level: O2

FT_UInt32 FT_Vector_NormLen(FT_Vector *vector)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  
  uVar1 = (uint)vector->x;
  uVar10 = -uVar1;
  if (0 < (int)uVar1) {
    uVar10 = uVar1;
  }
  uVar2 = (uint)vector->y;
  uVar8 = -uVar2;
  if (0 < (int)uVar2) {
    uVar8 = uVar2;
  }
  if (uVar1 == 0) {
    if (uVar2 == 0) {
      uVar8 = 0;
    }
    else {
      vector->y = (ulong)(~uVar2 >> 0xe & 0x20000) - 0x10000;
    }
  }
  else if (uVar2 == 0) {
    vector->x = (ulong)(~uVar1 >> 0xe & 0x20000) - 0x10000;
    uVar8 = uVar10;
  }
  else {
    uVar5 = (uVar10 >> 1) + uVar8;
    if (uVar8 < uVar10) {
      uVar5 = (uVar8 >> 1) + uVar10;
    }
    uVar6 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    iVar9 = ((uVar6 ^ 0x1f) - 0x10) +
            (uint)(uVar5 < (uint)(0xaaaaaaaaL >> ((byte)(uVar6 ^ 0x1f) & 0x3f)));
    bVar3 = (byte)iVar9;
    if (iVar9 < 1) {
      bVar4 = -bVar3;
      uVar10 = uVar10 >> (bVar4 & 0x1f);
      uVar8 = uVar8 >> (bVar4 & 0x1f);
      uVar5 = uVar5 >> (bVar4 & 0x1f);
    }
    else {
      uVar10 = uVar10 << (bVar3 & 0x1f);
      uVar8 = uVar8 << (bVar3 & 0x1f);
      uVar5 = (uVar10 >> 1) + uVar8;
      if (uVar8 < uVar10) {
        uVar5 = (uVar8 >> 1) + uVar10;
      }
    }
    iVar12 = 0x10000 - uVar5;
    do {
      uVar5 = ((int)(iVar12 * uVar10) >> 0x10) + uVar10;
      uVar7 = ((int)(iVar12 * uVar8) >> 0x10) + uVar8;
      uVar6 = (iVar12 + 0x10000 >> 8) * ((int)(uVar7 * uVar7 + uVar5 * uVar5) / -0x200);
      iVar12 = (uVar6 >> 0x10) + iVar12;
    } while (0xffff < (int)uVar6);
    uVar13 = -(ulong)uVar5;
    if (-1 < (int)uVar1) {
      uVar13 = (ulong)uVar5;
    }
    uVar11 = -(ulong)uVar7;
    if (-1 < (int)uVar2) {
      uVar11 = (ulong)uVar7;
    }
    iVar12 = (int)(uVar8 * uVar7 + uVar10 * uVar5) / 0x10000 + 0x10000;
    vector->x = uVar13;
    vector->y = uVar11;
    if (iVar9 < 1) {
      uVar8 = iVar12 << (-bVar3 & 0x1f);
    }
    else {
      uVar8 = (uint)(iVar12 + (1 << (bVar3 - 1 & 0x1f))) >> (bVar3 & 0x1f);
    }
  }
  return uVar8;
}

Assistant:

FT_BASE_DEF( FT_UInt32 )
  FT_Vector_NormLen( FT_Vector*  vector )
  {
    FT_Int32   x_ = vector->x;
    FT_Int32   y_ = vector->y;
    FT_Int32   b, z;
    FT_UInt32  x, y, u, v, l;
    FT_Int     sx = 1, sy = 1, shift;


    x = (FT_UInt32)x_;
    y = (FT_UInt32)y_;

    FT_MOVE_SIGN( x_, x, sx );
    FT_MOVE_SIGN( y_, y, sy );

    /* trivial cases */
    if ( x == 0 )
    {
      if ( y > 0 )
        vector->y = sy * 0x10000;
      return y;
    }
    else if ( y == 0 )
    {
      if ( x > 0 )
        vector->x = sx * 0x10000;
      return x;
    }

    /* Estimate length and prenormalize by shifting so that */
    /* the new approximate length is between 2/3 and 4/3.   */
    /* The magic constant 0xAAAAAAAAUL (2/3 of 2^32) helps  */
    /* achieve this in 16.16 fixed-point representation.    */
    l = x > y ? x + ( y >> 1 )
              : y + ( x >> 1 );

    shift  = 31 - FT_MSB( l );
    shift -= 15 + ( l >= ( 0xAAAAAAAAUL >> shift ) );

    if ( shift > 0 )
    {
      x <<= shift;
      y <<= shift;

      /* re-estimate length for tiny vectors */
      l = x > y ? x + ( y >> 1 )
                : y + ( x >> 1 );
    }
    else
    {
      x >>= -shift;
      y >>= -shift;
      l >>= -shift;
    }

    /* lower linear approximation for reciprocal length minus one */
    b = 0x10000 - (FT_Int32)l;

    x_ = (FT_Int32)x;
    y_ = (FT_Int32)y;

    /* Newton's iterations */
    do
    {
      u = (FT_UInt32)( x_ + ( x_ * b >> 16 ) );
      v = (FT_UInt32)( y_ + ( y_ * b >> 16 ) );

      /* Normalized squared length in the parentheses approaches 2^32. */
      /* On two's complement systems, converting to signed gives the   */
      /* difference with 2^32 even if the expression wraps around.     */
      z = -(FT_Int32)( u * u + v * v ) / 0x200;
      z = z * ( ( 0x10000 + b ) >> 8 ) / 0x10000;

      b += z;

    } while ( z > 0 );

    vector->x = sx < 0 ? -(FT_Pos)u : (FT_Pos)u;
    vector->y = sy < 0 ? -(FT_Pos)v : (FT_Pos)v;

    /* Conversion to signed helps to recover from likely wrap around */
    /* in calculating the prenormalized length, because it gives the */
    /* correct difference with 2^32 on two's complement systems.     */
    l = (FT_UInt32)( 0x10000 + (FT_Int32)( u * x + v * y ) / 0x10000 );
    if ( shift > 0 )
      l = ( l + ( 1 << ( shift - 1 ) ) ) >> shift;
    else
      l <<= -shift;

    return l;
  }